

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall
leveldb::RecoveryTest_LargeManifestCompacted_Test::TestBody
          (RecoveryTest_LargeManifestCompacted_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  uint64_t uVar4;
  Env *pEVar5;
  AssertHelper local_310;
  Message local_308;
  allocator local_2f9;
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_8;
  Message local_2a0;
  string local_298;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_7;
  Message local_260;
  allocator local_251;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  uint64_t local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  string new_manifest;
  Message local_188;
  Status local_180;
  char local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  Slice local_150;
  Status local_140;
  char local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_118 [8];
  string zeroes;
  Message local_f0;
  Status local_e8;
  char local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  WritableFile *file;
  uint64_t len;
  string old_manifest;
  AssertHelper local_90;
  Message local_88;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50;
  undefined1 local_30 [24];
  AssertionResult gtest_ar;
  RecoveryTest_LargeManifestCompacted_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  bVar2 = RecoveryTest::CanAppend(&this->super_RecoveryTest);
  if (bVar2) {
    test::IsOK();
    testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"foo",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"bar",&local_79);
    RecoveryTest::Put((RecoveryTest *)local_30,(string *)this,&local_50);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_30 + 0x10),
               local_30 + 0xf,(Status *)"Put(\"foo\", \"bar\")");
    Status::~Status((Status *)local_30);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_30 + 0x10));
    if (!bVar2) {
      testing::Message::Message(&local_88);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)(local_30 + 0x10));
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                 ,0xb8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_90,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      testing::Message::~Message(&local_88);
    }
    old_manifest.field_2._13_3_ = 0;
    old_manifest.field_2._M_local_buf[0xc] = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)(local_30 + 0x10));
    if (old_manifest.field_2._12_4_ == 0) {
      RecoveryTest::Close(&this->super_RecoveryTest);
      RecoveryTest::ManifestFileName_abi_cxx11_((string *)&len,&this->super_RecoveryTest);
      uVar4 = RecoveryTest::FileSize(&this->super_RecoveryTest,(string *)&len);
      test::IsOK();
      testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
      pEVar5 = RecoveryTest::env(&this->super_RecoveryTest);
      (*pEVar5->_vptr_Env[5])(&local_e8,pEVar5,&len,&gtest_ar_1.message_);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_d8,&local_d9,
                 (Status *)"env()->NewAppendableFile(old_manifest, &file)");
      Status::~Status(&local_e8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar2) {
        testing::Message::Message(&local_f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&zeroes.field_2 + 8),kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                   ,0xc0,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&zeroes.field_2 + 8),&local_f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&zeroes.field_2 + 8));
        testing::Message::~Message(&local_f0);
      }
      old_manifest.field_2._13_3_ = 0;
      old_manifest.field_2._M_local_buf[0xc] = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (old_manifest.field_2._12_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_118,0x300000 - uVar4,'\0',
                   (allocator *)
                   ((long)&gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 7));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 7));
        test::IsOK();
        testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
        uVar1 = gtest_ar_1.message_;
        Slice::Slice(&local_150,(string *)local_118);
        (**(code **)(*(long *)uVar1._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 0x10))
                  (&local_140,
                   uVar1._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,&local_150);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_130,&local_131
                   ,(Status *)"file->Append(zeroes)");
        Status::~Status(&local_140);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar2) {
          testing::Message::Message(&local_158);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                     ,0xc2,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_158);
        }
        old_manifest.field_2._13_3_ = 0;
        old_manifest.field_2._M_local_buf[0xc] = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (old_manifest.field_2._12_4_ == 0) {
          test::IsOK();
          testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
          (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x20))(&local_180);
          testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                    ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_170,
                     &local_171,(Status *)"file->Flush()");
          Status::~Status(&local_180);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar2) {
            testing::Message::Message(&local_188);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)((long)&new_manifest.field_2 + 8),kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                       ,0xc3,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)((long)&new_manifest.field_2 + 8),&local_188);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)((long)&new_manifest.field_2 + 8));
            testing::Message::~Message(&local_188);
          }
          old_manifest.field_2._13_3_ = 0;
          old_manifest.field_2._M_local_buf[0xc] = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          if (old_manifest.field_2._12_4_ == 0) {
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
            old_manifest.field_2._12_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_118);
        if (old_manifest.field_2._12_4_ == 0) {
          RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
          RecoveryTest::ManifestFileName_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,&this->super_RecoveryTest);
          testing::internal::CmpHelperNE<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)local_1c0,"old_manifest","new_manifest",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&len,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar_4.message_);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar2) {
            testing::Message::Message(&local_1c8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                       ,0xc9,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_1c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_1c8);
          }
          old_manifest.field_2._13_3_ = 0;
          old_manifest.field_2._M_local_buf[0xc] = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          if (old_manifest.field_2._12_4_ == 0) {
            local_1e4 = 10000;
            local_1f0 = RecoveryTest::FileSize
                                  (&this->super_RecoveryTest,(string *)&gtest_ar_4.message_);
            testing::internal::CmpHelperGT<int,unsigned_long>
                      ((internal *)local_1e0,"10000","FileSize(new_manifest)",&local_1e4,&local_1f0)
            ;
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
            if (!bVar2) {
              testing::Message::Message(&local_1f8);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                         ,0xca,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_1f8);
            }
            old_manifest.field_2._13_3_ = 0;
            old_manifest.field_2._M_local_buf[0xc] = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
            if (old_manifest.field_2._12_4_ == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_250,"foo",&local_251);
              RecoveryTest::Get(&local_230,&this->super_RecoveryTest,&local_250,(Snapshot *)0x0);
              testing::internal::EqHelper::
              Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                        ((EqHelper *)local_210,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",
                         &local_230);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_250);
              std::allocator<char>::~allocator((allocator<char> *)&local_251);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
              if (!bVar2) {
                testing::Message::Message(&local_260);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                           ,0xcb,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_260);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_260);
              }
              old_manifest.field_2._13_3_ = 0;
              old_manifest.field_2._M_local_buf[0xc] = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
              if (old_manifest.field_2._12_4_ == 0) {
                RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
                RecoveryTest::ManifestFileName_abi_cxx11_(&local_298,&this->super_RecoveryTest);
                testing::internal::EqHelper::
                Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                          ((EqHelper *)local_278,"new_manifest","ManifestFileName()",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar_4.message_,&local_298);
                std::__cxx11::string::~string((string *)&local_298);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_278);
                if (!bVar2) {
                  testing::Message::Message(&local_2a0);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                             ,0xce,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_2a0);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_2a0);
                }
                old_manifest.field_2._13_3_ = 0;
                old_manifest.field_2._M_local_buf[0xc] = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                if (old_manifest.field_2._12_4_ == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_2f8,"foo",&local_2f9);
                  RecoveryTest::Get(&local_2d8,&this->super_RecoveryTest,&local_2f8,(Snapshot *)0x0)
                  ;
                  testing::internal::EqHelper::
                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                            ((EqHelper *)local_2b8,"\"bar\"","Get(\"foo\")",(char (*) [4])"bar",
                             &local_2d8);
                  std::__cxx11::string::~string((string *)&local_2d8);
                  std::__cxx11::string::~string((string *)&local_2f8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2b8);
                  if (!bVar2) {
                    testing::Message::Message(&local_308);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_310,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
                               ,0xcf,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_310,&local_308);
                    testing::internal::AssertHelper::~AssertHelper(&local_310);
                    testing::Message::~Message(&local_308);
                  }
                  old_manifest.field_2._13_3_ = 0;
                  old_manifest.field_2._M_local_buf[0xc] = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                  if (old_manifest.field_2._12_4_ == 0) {
                    old_manifest.field_2._12_4_ = 0;
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
        }
      }
      std::__cxx11::string::~string((string *)&len);
    }
  }
  else {
    fprintf(_stderr,"skipping test because env does not support appending\n");
  }
  return;
}

Assistant:

TEST_F(RecoveryTest, LargeManifestCompacted) {
  if (!CanAppend()) {
    std::fprintf(stderr,
                 "skipping test because env does not support appending\n");
    return;
  }
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  Close();
  std::string old_manifest = ManifestFileName();

  // Pad with zeroes to make manifest file very big.
  {
    uint64_t len = FileSize(old_manifest);
    WritableFile* file;
    ASSERT_LEVELDB_OK(env()->NewAppendableFile(old_manifest, &file));
    std::string zeroes(3 * 1048576 - static_cast<size_t>(len), 0);
    ASSERT_LEVELDB_OK(file->Append(zeroes));
    ASSERT_LEVELDB_OK(file->Flush());
    delete file;
  }

  Open();
  std::string new_manifest = ManifestFileName();
  ASSERT_NE(old_manifest, new_manifest);
  ASSERT_GT(10000, FileSize(new_manifest));
  ASSERT_EQ("bar", Get("foo"));

  Open();
  ASSERT_EQ(new_manifest, ManifestFileName());
  ASSERT_EQ("bar", Get("foo"));
}